

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_formparse.c
# Opt level: O0

tool_mime * tool_mime_new_data(tool_mime *parent,char *mime_data)

{
  char *__ptr;
  tool_mime *local_28;
  tool_mime *m;
  char *mime_data_copy;
  char *mime_data_local;
  tool_mime *parent_local;
  
  local_28 = (tool_mime *)0x0;
  __ptr = strdup(mime_data);
  if (__ptr != (char *)0x0) {
    local_28 = tool_mime_new(parent,TOOLMIME_DATA);
    if (local_28 == (tool_mime *)0x0) {
      free(__ptr);
    }
    else {
      local_28->data = __ptr;
    }
  }
  return local_28;
}

Assistant:

static struct tool_mime *tool_mime_new_data(struct tool_mime *parent,
                                            char *mime_data)
{
  char *mime_data_copy;
  struct tool_mime *m = NULL;

  mime_data_copy = strdup(mime_data);
  if(mime_data_copy) {
    m = tool_mime_new(parent, TOOLMIME_DATA);
    if(!m)
      free(mime_data_copy);
    else
      m->data = mime_data_copy;
  }
  return m;
}